

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O1

void __thiscall
chrono::fea::Brick9_Mass::Evaluate
          (Brick9_Mass *this,ChMatrixNM<double,_33,_33> *result,double x,double y,double z)

{
  double dVar1;
  ChElementHexaANCF_3813_9 *this_00;
  int i;
  long lVar2;
  double *__s;
  ChMatrixNM<double,_1,_3> Nz_d0;
  ChMatrixNM<double,_1,_3> Ny_d0;
  ChMatrixNM<double,_1,_3> Nx_d0;
  ChMatrixNM<double,_1,_11> Nz;
  ShapeVector N;
  ChMatrixNM<double,_1,_11> Ny;
  ChMatrixNM<double,_3,_33> S;
  ChMatrixNM<double,_1,_11> Nx;
  ChMatrixNM<double,_1,_3> local_26a0;
  ChMatrixNM<double,_1,_3> local_2688;
  ChMatrixNM<double,_1,_3> local_2670;
  ShapeVector local_2658;
  ShapeVector local_2600;
  ShapeVector local_25a8;
  Matrix<double,_3,_33,_1,_3,_33> local_2550;
  Matrix<double,_33,_33,_0,_33,_33> local_2238;
  
  this_00 = this->m_element;
  ChElementHexaANCF_3813_9::ShapeFunctions(this_00,&local_2600,x,y,z);
  __s = (double *)&local_2550;
  lVar2 = 0;
  memset(__s,0,0x318);
  do {
    dVar1 = local_2600.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
            m_data.array[lVar2];
    *__s = dVar1;
    __s[0x22] = dVar1;
    __s[0x44] = dVar1;
    lVar2 = lVar2 + 1;
    __s = __s + 3;
  } while (lVar2 != 0xb);
  local_25a8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = ChElementHexaANCF_3813_9::Calc_detJ0
                  (this_00,x,y,z,(ShapeVector *)&local_2238,&local_25a8,&local_2658,&local_2670,
                   &local_2688,&local_26a0);
  local_25a8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = local_25a8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
        array[2] * this_00->m_GaussScaling;
  local_25a8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [3] = (double)&local_2550;
  local_25a8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = (double)&local_2550;
  memset(&local_2238,0,0x2208);
  local_2658.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,33,3,0,33,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,33,1,3,33>>const>,Eigen::Matrix<double,3,33,1,3,33>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,33,33,0,33,33>>
            (&local_2238,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_33,_3,_0,_33,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_33,_1,_3,_33>_>_>
              *)&local_25a8,&local_2550,(Scalar *)&local_2658);
  local_2658.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)&local_26a0;
  local_2688.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
       = (double)result;
  local_2670.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
       = (double)&local_2238;
  local_2658.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)&local_2688;
  local_2658.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [1] = (double)&local_2670;
  local_2658.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [3] = (double)result;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_33,_33,_0,_33,_33>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_1>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_33,_33,_0,_33,_33>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)&local_2658);
  return;
}

Assistant:

void Brick9_Mass::Evaluate(ChMatrixNM<double, 33, 33>& result, const double x, const double y, const double z) {
    ChElementHexaANCF_3813_9::ShapeVector N;
    m_element->ShapeFunctions(N, x, y, z);

    ChMatrixNM<double, 3, 33> S;
    S.setZero();

    for (int i = 0; i < 11; i++) {
        S(0, 3 * i + 0) = N(i);
        S(1, 3 * i + 1) = N(i);
        S(2, 3 * i + 2) = N(i);
    }

    double detJ0 = m_element->Calc_detJ0(x, y, z);

    // perform  r = S'*S
    result = detJ0 * m_element->m_GaussScaling * S.transpose() * S;
}